

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QList<int>>>::
     call<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>
               (QPromise<QList<int>_> *promise,QPromiseResolve<QList<int>_> *resolve,
               QPromiseReject<QList<int>_> *reject)

{
  QSharedData *pQVar1;
  bool bVar2;
  anon_class_24_2_d74e9aa7 local_58;
  Data *local_40;
  undefined **local_38;
  PromiseData<QList<int>_> *local_30;
  QPromiseBase<void> local_28;
  
  bVar2 = QtPromise::QPromiseBase<QList<int>_>::isFulfilled
                    (&promise->super_QPromiseBase<QList<int>_>);
  if (bVar2) {
    PromiseResolver<QList<int>>::resolve<QtPromisePrivate::PromiseValue<QList<int>>const&>
              ((PromiseResolver<QList<int>> *)resolve,
               &((promise->super_QPromiseBase<QList<int>_>).m_d.d)->m_value);
    return;
  }
  bVar2 = QtPromise::QPromiseBase<QList<int>_>::isRejected
                    (&promise->super_QPromiseBase<QList<int>_>);
  if (bVar2) {
    PromiseResolver<QList<int>>::reject<QtPromisePrivate::PromiseError_const&>
              ((PromiseResolver<QList<int>> *)reject,
               &(((promise->super_QPromiseBase<QList<int>_>).m_d.d)->
                super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error);
    return;
  }
  local_58.reject.m_resolver.m_d.d = (PromiseResolver<QList<int>_>)(resolve->m_resolver).m_d.d;
  if (local_58.reject.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)0x0) {
    LOCK();
    (((Data *)local_58.reject.m_resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((Data *)local_58.reject.m_resolver.m_d.d)->super_QSharedData).ref.
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_58.promise.super_QPromiseBase<QList<int>_>.m_d.d =
       (promise->super_QPromiseBase<QList<int>_>).m_d.d;
  if (local_58.promise.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((local_58.promise.super_QPromiseBase<QList<int>_>.m_d.d)->
              super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_58.promise.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_00142488;
  local_40 = (reject->m_resolver).m_d.d;
  if (local_40 != (Data *)0x0) {
    LOCK();
    (local_40->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(local_40->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_30 = (promise->super_QPromiseBase<QList<int>_>).m_d.d;
  if (local_30 != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &(local_30->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_38 = &PTR__QPromiseBase_00142488;
  QtPromise::QPromiseBase<QList<int>>::
  then<QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QList<int>>>::call<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>(QtPromise::QPromise<QList<int>>const&,QtPromise::QPromiseResolve<QList<int>>const&,QtPromise::QPromiseReject<QList<int>>const&)::_lambda()_1_,QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QList<int>>>::call<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>(QtPromise::QPromise<QList<int>>const&,QtPromise::QPromiseResolve<QList<int>>const&,QtPromise::QPromiseReject<QList<int>>const&)::_lambda()_2_>
            ((QPromiseBase<QList<int>> *)&local_28,(anon_class_24_2_e6a34898 *)promise,&local_58);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_28);
  call<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>(QtPromise::QPromise<QList<int>>const&,QtPromise::QPromiseResolve<QList<int>>const&,QtPromise::QPromiseReject<QList<int>>const&)
  ::{lambda()#2}::~call((_lambda___2_ *)&local_40);
  call<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>(QtPromise::QPromise<QList<int>>const&,QtPromise::QPromiseResolve<QList<int>>const&,QtPromise::QPromiseReject<QList<int>>const&)
  ::{lambda()#1}::~call((_lambda___1_ *)&local_58);
  return;
}

Assistant:

static void
    call(const QtPromise::QPromise<T>& promise, const TResolve& resolve, const TReject& reject)
    {
        if (promise.isFulfilled()) {
            resolve(promise.m_d->value());
        } else if (promise.isRejected()) {
            reject(promise.m_d->error());
        } else {
            promise.then(
                [=]() {
                    resolve(promise.m_d->value());
                },
                [=]() { // catch all
                    reject(promise.m_d->error());
                });
        }
    }